

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O0

int32_t benchmark::Int32FromEnv(char *flag,int32_t default_value)

{
  bool bVar1;
  string *src_text;
  ostream *poVar2;
  int32_t in_ESI;
  int32_t result;
  char *string_value;
  string env_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  allocator *value;
  string *str;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int32_t iVar3;
  string local_38 [36];
  int32_t local_14;
  int32_t local_4;
  
  str = local_38;
  local_14 = in_ESI;
  FlagToEnvVar_abi_cxx11_((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::__cxx11::string::c_str();
  src_text = (string *)GetEnv((char *)0x177002);
  if (src_text == (string *)0x0) {
    local_4 = local_14;
  }
  else {
    value = &local_99;
    iVar3 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Environment variable ",value);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    bVar1 = ParseInt32(src_text,(char *)str,(int32_t *)value);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_4 = iVar3;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"The default value ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
      std::operator<<(poVar2," is used.\n");
      local_4 = local_14;
    }
  }
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

int32_t Int32FromEnv(const char* flag, int32_t default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  int32_t result = default_value;
  if (!ParseInt32(std::string("Environment variable ") + env_var, string_value,
                  &result)) {
    std::cout << "The default value " << default_value << " is used.\n";
    return default_value;
  }

  return result;
}